

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O0

void N_VDestroy_SensWrapper(N_Vector v)

{
  long *in_RDI;
  int i;
  int local_c;
  
  if (*(int *)(*in_RDI + 0xc) == 1) {
    for (local_c = 0; local_c < *(int *)(*in_RDI + 8); local_c = local_c + 1) {
      if (*(long *)(*(long *)*in_RDI + (long)local_c * 8) != 0) {
        N_VDestroy((N_Vector)0x1188a80);
      }
      *(undefined8 *)(*(long *)*in_RDI + (long)local_c * 8) = 0;
    }
  }
  free(*(void **)*in_RDI);
  *(undefined8 *)*in_RDI = 0;
  free((void *)*in_RDI);
  *in_RDI = 0;
  free((void *)in_RDI[1]);
  in_RDI[1] = 0;
  free(in_RDI);
  return;
}

Assistant:

void N_VDestroy_SensWrapper(N_Vector v)
{
  int i;

  if (NV_OWN_VECS_SW(v) == SUNTRUE) {
    for (i=0; i < NV_NVECS_SW(v); i++) {
      if (NV_VEC_SW(v,i)) N_VDestroy(NV_VEC_SW(v,i));
      NV_VEC_SW(v,i) = NULL;
    }
  }

  free(NV_VECS_SW(v)); NV_VECS_SW(v) = NULL;
  free(v->content); v->content = NULL;
  free(v->ops); v->ops = NULL;
  free(v); v = NULL;

  return;
}